

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

AActor * P_SpawnMissileZAimed(AActor *source,double z,AActor *dest,PClassActor *type)

{
  int iVar1;
  AActor *pAVar2;
  double dVar3;
  double speed;
  double vz;
  double local_38;
  DAngle local_20;
  
  if (type == (PClassActor *)0x0 || source == (AActor *)0x0) {
    return (AActor *)0x0;
  }
  local_38 = (source->Angles).Yaw.Degrees;
  if (((dest->flags).Value & 0x40000) != 0) {
    iVar1 = FRandom::Random2(&pr_spawnmissile);
    local_38 = local_38 + (double)iVar1 * 0.044444444444444446;
  }
  dVar3 = AActor::Distance2D(source,dest,false);
  speed = GetDefaultSpeed(type);
  dVar3 = dVar3 / speed;
  if ((dVar3 != 0.0) || (vz = speed, NAN(dVar3))) {
    vz = ((dest->__Pos).Z - (source->__Pos).Z) / dVar3;
  }
  local_20.Degrees = local_38;
  pAVar2 = P_SpawnMissileAngleZSpeed(source,z,type,&local_20,vz,speed,(AActor *)0x0,true);
  return pAVar2;
}

Assistant:

AActor *P_SpawnMissileZAimed (AActor *source, double z, AActor *dest, PClassActor *type)
{
	if (source == nullptr || type == nullptr)
	{
		return nullptr;
	}
	DAngle an;
	double dist;
	double speed;
	double vz;

	an = source->Angles.Yaw;

	if (dest->flags & MF_SHADOW)
	{
		an += pr_spawnmissile.Random2() * (16. / 360.);
	}
	dist = source->Distance2D (dest);
	speed = GetDefaultSpeed (type);
	dist /= speed;
	vz = dist != 0 ? (dest->Z() - source->Z())/dist : speed;
	return P_SpawnMissileAngleZSpeed (source, z, type, an, vz, speed);
}